

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  ostream *os;
  StringRef passOrFail;
  int iVar2;
  Code colour;
  char *pcVar3;
  size_type in_R9;
  StringRef passOrFail_00;
  StringRef passOrFail_01;
  StringRef passOrFail_02;
  StringRef passOrFail_03;
  StringRef passOrFail_04;
  StringRef passOrFail_05;
  StringRef passOrFail_06;
  StringRef passOrFail_07;
  StringRef passOrFail_08;
  StringRef lhs;
  StringRef rhs;
  size_type sStack_90;
  AssertionPrinter local_80;
  undefined1 local_50 [32];
  SourceLineInfo local_30;
  
  iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  local_80.printInfoMessages = true;
  if ((((char)iVar2 == '\0') &&
      (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
        (OVar1 & FailureBit) == Ok ||
        (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
       (local_80.printInfoMessages = false, OVar1 != ExplicitSkip)))) && (OVar1 != Warning)) {
    return;
  }
  os = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  local_80.colourImpl = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  local_80.messages = &_assertionStats->infoMessages;
  local_50._8_4_ = FileName;
  local_50[0xc] = true;
  local_80.stream = os;
  local_80.result = &_assertionStats->assertionResult;
  local_50._0_8_ = local_80.colourImpl;
  (*(local_80.colourImpl)->_vptr_ColourImpl[2])(local_80.colourImpl,0x17);
  local_30.file = (_assertionStats->assertionResult).m_info.lineInfo.file;
  local_30.line = (_assertionStats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<(os,&local_30);
  std::operator<<(os,':');
  ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_50);
  local_80.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  OVar1 = (_assertionStats->assertionResult).m_resultData.resultType;
  switch(OVar1) {
  case Ok:
    passOrFail_00.m_size = 6;
    passOrFail_00.m_start = "passed";
    anon_unknown_26::AssertionPrinter::printResultType(&local_80,BrightGreen,passOrFail_00);
    anon_unknown_26::AssertionPrinter::printOriginalExpression(&local_80);
    anon_unknown_26::AssertionPrinter::printReconstructedExpression(&local_80);
    if ((_assertionStats->assertionResult).m_info.capturedExpression.m_size == 0) goto LAB_00143af5;
    colour = FileName;
    break;
  case Info:
    pcVar3 = "info";
    sStack_90 = 4;
    goto LAB_0014399b;
  case Warning:
    pcVar3 = "warning";
    sStack_90 = 7;
LAB_0014399b:
    passOrFail_04.m_size = sStack_90;
    passOrFail_04.m_start = pcVar3;
    anon_unknown_26::AssertionPrinter::printResultType(&local_80,None,passOrFail_04);
    anon_unknown_26::AssertionPrinter::printMessage(&local_80);
LAB_00143ac6:
    colour = FileName;
    break;
  case Warning|Info:
  case ExplicitSkip|Info:
  case ExplicitSkip|Warning:
  case ExplicitSkip|Warning|Info:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    goto switchD_001438a1_caseD_3;
  case ExplicitSkip:
    colour = FileName;
    passOrFail_03.m_size = 7;
    passOrFail_03.m_start = "skipped";
    anon_unknown_26::AssertionPrinter::printResultType(&local_80,FileName,passOrFail_03);
    anon_unknown_26::AssertionPrinter::printMessage(&local_80);
    break;
  case ExpressionFailed:
    if (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0) {
      passOrFail_05.m_size = 6;
      passOrFail_05.m_start = "failed";
      anon_unknown_26::AssertionPrinter::printResultType(&local_80,BrightRed,passOrFail_05);
    }
    else {
      lhs.m_size = (size_type)" - but was ok";
      lhs.m_start = (char *)0x6;
      rhs.m_size = in_R9;
      rhs.m_start = (char *)0xd;
      operator+[abi_cxx11_((string *)local_50,(Catch *)0x16ce8c,lhs,rhs);
      passOrFail.m_size._0_4_ = local_50._8_4_;
      passOrFail.m_start = (char *)local_50._0_8_;
      passOrFail.m_size._4_4_ = local_50._12_4_;
      anon_unknown_26::AssertionPrinter::printResultType(&local_80,BrightGreen,passOrFail);
      std::__cxx11::string::~string((string *)local_50);
    }
    anon_unknown_26::AssertionPrinter::printOriginalExpression(&local_80);
    anon_unknown_26::AssertionPrinter::printReconstructedExpression(&local_80);
    goto LAB_00143ac6;
  case ExplicitFailure:
    passOrFail_06.m_size = 6;
    passOrFail_06.m_start = "failed";
    anon_unknown_26::AssertionPrinter::printResultType(&local_80,BrightRed,passOrFail_06);
    anon_unknown_26::AssertionPrinter::printIssue(&local_80,"explicitly");
LAB_00143af5:
    colour = None;
    break;
  case Unknown:
  case FailureBit:
    goto switchD_001438a1_caseD_ffffffff;
  default:
    if (OVar1 != Exception) {
      if (OVar1 == ThrewException) {
        passOrFail_07.m_size = 6;
        passOrFail_07.m_start = "failed";
        anon_unknown_26::AssertionPrinter::printResultType(&local_80,BrightRed,passOrFail_07);
        pcVar3 = "unexpected exception with message:";
LAB_00143a2c:
        anon_unknown_26::AssertionPrinter::printIssue(&local_80,pcVar3);
        anon_unknown_26::AssertionPrinter::printMessage(&local_80);
      }
      else {
        if (OVar1 != DidntThrowException) {
          if (OVar1 != FatalErrorCondition) goto switchD_001438a1_caseD_3;
          passOrFail_01.m_size = 6;
          passOrFail_01.m_start = "failed";
          anon_unknown_26::AssertionPrinter::printResultType(&local_80,BrightRed,passOrFail_01);
          pcVar3 = "fatal error condition with message:";
          goto LAB_00143a2c;
        }
        passOrFail_08.m_size = 6;
        passOrFail_08.m_start = "failed";
        anon_unknown_26::AssertionPrinter::printResultType(&local_80,BrightRed,passOrFail_08);
        anon_unknown_26::AssertionPrinter::printIssue(&local_80,"expected exception, got none");
      }
      anon_unknown_26::AssertionPrinter::printExpressionWas(&local_80);
      goto LAB_00143ac6;
    }
    goto switchD_001438a1_caseD_ffffffff;
  }
  anon_unknown_26::AssertionPrinter::printRemainingMessages(&local_80,colour);
switchD_001438a1_caseD_3:
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  std::ostream::flush();
  return;
switchD_001438a1_caseD_ffffffff:
  passOrFail_02.m_size = 0x14;
  passOrFail_02.m_start = "** internal error **";
  anon_unknown_26::AssertionPrinter::printResultType(&local_80,BrightRed,passOrFail_02);
  goto switchD_001438a1_caseD_3;
}

Assistant:

void CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip )
                    return;
                printInfoMessages = false;
            }

            AssertionPrinter printer( m_stream, _assertionStats, printInfoMessages, m_colour.get() );
            printer.print();

            m_stream << '\n' << std::flush;
        }